

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_67::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  FuncType *pFVar1;
  pointer pTVar2;
  Location local_98;
  Var local_78;
  allocator_type local_29;
  
  if (sig_type < Any) {
    decl->has_func_type = false;
    pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar2) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar2;
    }
    local_98.filename.data_ = (char *)CONCAT44(local_98.filename.data_._4_4_,sig_type);
    if (sig_type == Void) {
      local_78.loc.filename.data_ = (char *)0x0;
      local_78.loc.filename.size_ = 0;
      local_78.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    }
    else {
      std::vector<wabt::Type,std::allocator<wabt::Type>>::vector<wabt::Type*,void>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_78,(Type *)&local_98,
                 (Type *)((long)&local_98.filename.data_ + 4),&local_29);
    }
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78.loc.filename.data_;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_78.loc.filename.size_;
    (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78.loc.field_1.field_1.offset;
    local_78.loc.filename.data_ = (char *)0x0;
    local_78.loc.filename.size_ = 0;
    local_78.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    if (pTVar2 != (pointer)0x0) {
      operator_delete(pTVar2);
    }
    if (local_78.loc.filename.data_ != (char *)0x0) {
      operator_delete(local_78.loc.filename.data_);
    }
  }
  else {
    decl->has_func_type = true;
    local_98.field_1.field_0.line = 0;
    local_98.field_1._4_8_ = 0;
    local_98.filename.data_ = (char *)0x0;
    local_98.filename.size_._0_4_ = 0;
    local_98.filename.size_._4_4_ = 0;
    Var::Var(&local_78,sig_type,&local_98);
    Var::operator=(&decl->type_var,&local_78);
    Var::~Var(&local_78);
    pFVar1 = (this->module_->func_types).
             super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)sig_type];
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (&(decl->sig).param_types,&(pFVar1->sig).param_types);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (&(decl->sig).result_types,&(pFVar1->sig).result_types);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (IsTypeIndex(sig_type)) {
    Index type_index = GetTypeIndex(sig_type);
    decl->has_func_type = true;
    decl->type_var = Var(type_index);
    decl->sig = module_->func_types[type_index]->sig;
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = GetInlineTypeVector(sig_type);
  }
}